

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O0

char  [7] __thiscall
kj::
str<kj::_::DebugComparison<std::_Rb_tree_const_iterator<kj::StringPtr>,std::_Rb_tree_const_iterator<kj::StringPtr>>&>
          (kj *this,
          DebugComparison<std::_Rb_tree_const_iterator<kj::StringPtr>,_std::_Rb_tree_const_iterator<kj::StringPtr>_>
          *params)

{
  DebugComparison<std::_Rb_tree_const_iterator<kj::StringPtr>,_std::_Rb_tree_const_iterator<kj::StringPtr>_>
  *value;
  String local_30;
  DebugComparison<std::_Rb_tree_const_iterator<kj::StringPtr>,_std::_Rb_tree_const_iterator<kj::StringPtr>_>
  *local_18;
  DebugComparison<std::_Rb_tree_const_iterator<kj::StringPtr>,_std::_Rb_tree_const_iterator<kj::StringPtr>_>
  *params_local;
  
  local_18 = params;
  params_local = (DebugComparison<std::_Rb_tree_const_iterator<kj::StringPtr>,_std::_Rb_tree_const_iterator<kj::StringPtr>_>
                  *)this;
  value = fwd<kj::_::DebugComparison<std::_Rb_tree_const_iterator<kj::StringPtr>,std::_Rb_tree_const_iterator<kj::StringPtr>>&>
                    (params);
  toCharSequence<kj::_::DebugComparison<std::_Rb_tree_const_iterator<kj::StringPtr>,std::_Rb_tree_const_iterator<kj::StringPtr>>&>
            ((kj *)&local_30,value);
  _::concat((String *)this,&local_30);
  String::~String(&local_30);
  return SUB87(this,0);
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}